

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O2

Aig_Obj_t * Saig_ManGetLabeledRegister_rec(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t **ppAVar3;
  
  do {
    if (pObj->TravId == p->nTravIds) {
      return (Aig_Obj_t *)0x0;
    }
    pObj->TravId = p->nTravIds;
    iVar1 = Saig_ObjIsPi(p,pObj);
    if (iVar1 != 0) {
      return (Aig_Obj_t *)0x0;
    }
    iVar1 = Saig_ObjIsLo(p,pObj);
    if (iVar1 == 0) {
      if (((uint)*(ulong *)&pObj->field_0x18 & 7) - 7 < 0xfffffffe) {
        __assert_fail("Aig_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigMiter.c"
                      ,0x375,"Aig_Obj_t *Saig_ManGetLabeledRegister_rec(Aig_Man_t *, Aig_Obj_t *)");
      }
      pAVar2 = Saig_ManGetLabeledRegister_rec
                         (p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
      if (pAVar2 != (Aig_Obj_t *)0x0) {
        return pAVar2;
      }
      ppAVar3 = &pObj->pFanin1;
    }
    else {
      if ((*(ulong *)&pObj->field_0x18 & 0x30) != 0) {
        return pObj;
      }
      pAVar2 = Saig_ObjLoToLi(p,pObj);
      ppAVar3 = &pAVar2->pFanin0;
    }
    pObj = (Aig_Obj_t *)((ulong)*ppAVar3 & 0xfffffffffffffffe);
  } while( true );
}

Assistant:

Aig_Obj_t * Saig_ManGetLabeledRegister_rec( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    Aig_Obj_t * pResult;
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return NULL;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Saig_ObjIsPi(p, pObj) )
        return NULL;
    if ( Saig_ObjIsLo(p, pObj) )
    {
        if ( pObj->fMarkA || pObj->fMarkB )
            return pObj;
        return Saig_ManGetLabeledRegister_rec( p, Aig_ObjFanin0( Saig_ObjLoToLi(p, pObj) ) );
    }
    assert( Aig_ObjIsNode(pObj) );
    pResult = Saig_ManGetLabeledRegister_rec( p, Aig_ObjFanin0(pObj) );
    if ( pResult )
        return pResult;
    return Saig_ManGetLabeledRegister_rec( p, Aig_ObjFanin1(pObj) );
}